

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.cpp
# Opt level: O2

EventDefinition * findEventByName(String *a)

{
  EventDefinition *this;
  _Elt_pointer ppEVar1;
  __type _Var2;
  _Elt_pointer ppEVar3;
  _Map_pointer local_88;
  _Elt_pointer local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppEVar1 = Events._deque.super__Deque_base<EventDefinition_*,_std::allocator<EventDefinition_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_80 = Events._deque.super__Deque_base<EventDefinition_*,_std::allocator<EventDefinition_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
  local_88 = Events._deque.super__Deque_base<EventDefinition_*,_std::allocator<EventDefinition_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  ppEVar3 = Events._deque.super__Deque_base<EventDefinition_*,_std::allocator<EventDefinition_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  while( true ) {
    if (ppEVar3 == ppEVar1) {
      return (EventDefinition *)0x0;
    }
    this = *ppEVar3;
    String::toUppercase((String *)&local_70,a);
    String::toUppercase((String *)&local_50,&this->name);
    _Var2 = std::operator==(&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (_Var2) break;
    ppEVar3 = ppEVar3 + 1;
    if (ppEVar3 == local_80) {
      ppEVar3 = local_88[1];
      local_88 = local_88 + 1;
      local_80 = ppEVar3 + 0x40;
    }
  }
  return this;
}

Assistant:

EventDefinition* findEventByName (String a)
{
	for (EventDefinition* e : Events)
	{
		if (a.toUppercase() == e->name.toUppercase())
			return e;
	}

	return null;
}